

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMT_SENSITIVE_Marshal(TPMT_SENSITIVE *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  
  UINT16_Marshal(&source->sensitiveType,buffer,size);
  UVar1 = TPM2B_DIGEST_Marshal(&source->authValue,buffer,size);
  UVar2 = TPM2B_DIGEST_Marshal(&source->seedValue,buffer,size);
  UVar3 = TPMU_SENSITIVE_COMPOSITE_Marshal
                    (&source->sensitive,buffer,size,(uint)source->sensitiveType);
  return UVar3 + UVar2 + UVar1 + 2;
}

Assistant:

UINT16
TPMT_SENSITIVE_Marshal(TPMT_SENSITIVE *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMI_ALG_PUBLIC_Marshal((TPMI_ALG_PUBLIC *)&(source->sensitiveType), buffer, size));
    result = (UINT16)(result + TPM2B_AUTH_Marshal((TPM2B_AUTH *)&(source->authValue), buffer, size));
    result = (UINT16)(result + TPM2B_DIGEST_Marshal((TPM2B_DIGEST *)&(source->seedValue), buffer, size));
    result = (UINT16)(result + TPMU_SENSITIVE_COMPOSITE_Marshal((TPMU_SENSITIVE_COMPOSITE *)&(source->sensitive), buffer, size, (UINT32)source->sensitiveType));
    return result;
}